

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O2

vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::MoveSegments
          (vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *__return_storage_ptr__,
          SegmentTree<duckdb::RowGroup,_true> *this)

{
  SegmentLock l;
  unique_lock<std::mutex> uStack_28;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->node_lock);
  MoveSegments(__return_storage_ptr__,this,(SegmentLock *)&uStack_28);
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return __return_storage_ptr__;
}

Assistant:

vector<SegmentNode<T>> MoveSegments() {
		auto l = Lock();
		return MoveSegments(l);
	}